

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ms_gauden.c
# Opt level: O2

int32 gauden_dist(gauden_t *g,int mgau,int32 n_top,mfcc_t **obs,gauden_dist_t **out_dist)

{
  uint uVar1;
  uint uVar2;
  gauden_dist_t *pgVar3;
  mfcc_t *pmVar4;
  mfcc_t **ppmVar5;
  mfcc_t **ppmVar6;
  mfcc_t *pmVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  mfcc_t mVar12;
  float fVar13;
  
  if ((n_top < 1) || (g->n_density < n_top)) {
    __assert_fail("(n_top > 0) && (n_top <= g->n_density)",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                  ,0x1f1,"int32 gauden_dist(gauden_t *, int, int32, mfcc_t **, gauden_dist_t **)");
  }
  lVar11 = 0;
  do {
    if (g->n_feat <= lVar11) {
      return 0;
    }
    pgVar3 = out_dist[lVar11];
    pmVar4 = obs[lVar11];
    uVar1 = g->featlen[lVar11];
    ppmVar5 = g->mean[mgau][lVar11];
    ppmVar6 = g->var[mgau][lVar11];
    pmVar7 = g->det[mgau][lVar11];
    uVar2 = g->n_density;
    if (n_top < (int)uVar2) {
      for (uVar8 = 0; (uint)n_top != uVar8; uVar8 = uVar8 + 1) {
        pgVar3[uVar8].dist = -2.1474836e+09;
      }
      if ((int)uVar1 < 1) {
        uVar1 = 0;
      }
      for (uVar8 = 0; uVar8 != uVar2; uVar8 = uVar8 + 1) {
        mVar12 = pmVar7[uVar8];
        for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
          if ((float)mVar12 < (float)pgVar3[n_top - 1].dist) goto LAB_00146daa;
          fVar13 = (float)pmVar4[uVar10] - (float)ppmVar5[uVar8][uVar10];
          mVar12 = (mfcc_t)((float)mVar12 - fVar13 * fVar13 * (float)ppmVar6[uVar8][uVar10]);
        }
        if ((float)pgVar3[n_top - 1].dist <= (float)mVar12) {
          uVar10 = 0;
          while( true ) {
            if ((uint)n_top == uVar10) {
              __assert_fail("i < n_top",
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ms_gauden.c"
                            ,0x1db,
                            "int32 compute_dist(gauden_dist_t *, int32, mfcc_t *, int32, mfcc_t **, mfcc_t **, mfcc_t *, int32)"
                           );
            }
            uVar9 = (ulong)(n_top - 1);
            if ((float)pgVar3[uVar10].dist <= (float)mVar12) break;
            uVar10 = uVar10 + 1;
          }
          for (; (long)uVar10 < (long)uVar9; uVar9 = uVar9 - 1) {
            pgVar3[uVar9] = pgVar3[uVar9 - 1];
          }
          pgVar3[uVar10].dist = mVar12;
          pgVar3[uVar10].id = (int32)uVar8;
        }
LAB_00146daa:
      }
    }
    else {
      if ((int)uVar1 < 1) {
        uVar1 = 0;
      }
      if ((int)uVar2 < 1) {
        uVar2 = 0;
      }
      for (uVar8 = 0; uVar8 != uVar2; uVar8 = uVar8 + 1) {
        mVar12 = pmVar7[uVar8];
        for (uVar10 = 0; uVar1 != uVar10; uVar10 = uVar10 + 1) {
          fVar13 = (float)pmVar4[uVar10] - (float)ppmVar5[uVar8][uVar10];
          mVar12 = (mfcc_t)((float)mVar12 - fVar13 * fVar13 * (float)ppmVar6[uVar8][uVar10]);
        }
        pgVar3[uVar8].dist = mVar12;
        pgVar3[uVar8].id = (int32)uVar8;
      }
    }
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

int32
gauden_dist(gauden_t * g,
            int mgau, int32 n_top, mfcc_t** obs, gauden_dist_t ** out_dist)
{
    int32 f;

    assert((n_top > 0) && (n_top <= g->n_density));

    for (f = 0; f < g->n_feat; f++) {
        compute_dist(out_dist[f], n_top,
                     obs[f], g->featlen[f],
                     g->mean[mgau][f], g->var[mgau][f], g->det[mgau][f],
                     g->n_density);
        E_DEBUG("Top CW(%d,%d) = %d %d\n", mgau, f, out_dist[f][0].id,
                (int)out_dist[f][0].dist >> SENSCR_SHIFT);
    }

    return 0;
}